

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_alps_parse_serverhello_impl
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents,bool use_new_codepoint)

{
  undefined1 *puVar1;
  SSL_CONFIG *pSVar2;
  uint8_t *__src;
  size_t new_size;
  bool bVar3;
  uint16_t uVar4;
  bool bVar5;
  ptrdiff_t _Num;
  Array<unsigned_char> *this;
  
  bVar5 = true;
  if (contents != (CBS *)0x0) {
    if ((hs->ssl->s3->field_0xdc & 0x10) != 0) {
      __assert_fail("!ssl->s3->initial_handshake_complete",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xd1f,
                    "bool bssl::ext_alps_parse_serverhello_impl(SSL_HANDSHAKE *, uint8_t *, CBS *, bool)"
                   );
    }
    pSVar2 = hs->config;
    if ((pSVar2->alpn_client_proto_list).size_ == 0) {
      __assert_fail("!hs->config->alpn_client_proto_list.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xd20,
                    "bool bssl::ext_alps_parse_serverhello_impl(SSL_HANDSHAKE *, uint8_t *, CBS *, bool)"
                   );
    }
    if ((pSVar2->alps_configs).size_ == 0) {
      __assert_fail("!hs->config->alps_configs.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xd21,
                    "bool bssl::ext_alps_parse_serverhello_impl(SSL_HANDSHAKE *, uint8_t *, CBS *, bool)"
                   );
    }
    if (((pSVar2->field_0x10e & 0x20) == 0) == use_new_codepoint) {
      __assert_fail("use_new_codepoint == hs->config->alps_use_new_codepoint",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xd22,
                    "bool bssl::ext_alps_parse_serverhello_impl(SSL_HANDSHAKE *, uint8_t *, CBS *, bool)"
                   );
    }
    uVar4 = ssl_protocol_version(hs->ssl);
    if (uVar4 < 0x304) {
      *out_alert = 'n';
      bVar5 = false;
      ERR_put_error(0x10,0,0xde,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0xd27);
    }
    else {
      this = &((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
               ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
              peer_application_settings;
      __src = contents->data;
      new_size = contents->len;
      bVar3 = Array<unsigned_char>::InitUninitialized(this,new_size);
      if (new_size != 0 && bVar3) {
        memmove(this->data_,__src,new_size);
      }
      if (bVar3) {
        puVar1 = &((hs->new_session)._M_t.
                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->field_0x1b8;
        *puVar1 = *puVar1 | 0x40;
      }
      else {
        *out_alert = 'P';
        bVar5 = false;
      }
    }
  }
  return bVar5;
}

Assistant:

static bool ext_alps_parse_serverhello_impl(SSL_HANDSHAKE *hs,
                                            uint8_t *out_alert, CBS *contents,
                                            bool use_new_codepoint) {
  SSL *const ssl = hs->ssl;
  if (contents == nullptr) {
    return true;
  }

  assert(!ssl->s3->initial_handshake_complete);
  assert(!hs->config->alpn_client_proto_list.empty());
  assert(!hs->config->alps_configs.empty());
  assert(use_new_codepoint == hs->config->alps_use_new_codepoint);

  // ALPS requires TLS 1.3.
  if (ssl_protocol_version(ssl) < TLS1_3_VERSION) {
    *out_alert = SSL_AD_UNSUPPORTED_EXTENSION;
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_EXTENSION);
    return false;
  }

  // Note extension callbacks may run in any order, so we defer checking
  // consistency with ALPN to |ssl_check_serverhello_tlsext|.
  if (!hs->new_session->peer_application_settings.CopyFrom(*contents)) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  hs->new_session->has_application_settings = true;
  return true;
}